

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_select_ifaces.hpp
# Opt level: O0

void __thiscall so_5::mchain_props::select_case_t::notify(select_case_t *this)

{
  undefined8 *puVar1;
  select_case_t *psVar2;
  select_notificator_t *notificator;
  select_case_t *next;
  select_case_t *c;
  select_case_t *this_local;
  
  next = this;
  while (next != (select_case_t *)0x0) {
    psVar2 = giveout_next(next);
    puVar1 = *(undefined8 **)(next + 0x10);
    *(undefined8 *)(next + 0x10) = 0;
    (**(code **)*puVar1)(puVar1,next);
    next = psVar2;
  }
  return;
}

Assistant:

void
		notify() SO_5_NOEXCEPT
			{
				auto c = this;
				while( c )
					{
						auto next = c->giveout_next();

						auto notificator = c->m_notificator;
						// Notificator for select_case must be dropped because
						// select_case do not belong to select_case queue anymore.
						c->m_notificator = nullptr;
						notificator->notify( *c );

						c = next;
					}
			}